

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline_listener.c
# Opt level: O3

void ht_timeline_listener_container_unref(HT_TimelineListenerContainer *container)

{
  uint32_t *puVar1;
  
  if (container == (HT_TimelineListenerContainer *)0x0) {
    __assert_fail("container",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/timeline_listener.c"
                  ,0x77,"void ht_timeline_listener_container_unref(HT_TimelineListenerContainer *)")
    ;
  }
  ht_mutex_lock(container->mutex);
  puVar1 = &container->refcount;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    ht_mutex_unlock(container->mutex);
    return;
  }
  _ht_timeline_listener_container_unregister_all_listeners(container);
  ht_free((container->entries).data);
  (container->entries).capacity = 0;
  (container->entries).size = 0;
  (container->entries).data = (HT_TimelineListenerEntry *)0x0;
  ht_mutex_unlock(container->mutex);
  ht_mutex_destroy(container->mutex);
  ht_free(container);
  return;
}

Assistant:

void
ht_timeline_listener_container_unref(HT_TimelineListenerContainer* container)
{
    assert(container);

    ht_mutex_lock(container->mutex);

    if (--container->refcount == 0)
    {
        _ht_timeline_listener_container_unregister_all_listeners(container);
        ht_bag_listener_deinit(&container->entries);
        ht_mutex_unlock(container->mutex);
        ht_mutex_destroy(container->mutex);

        ht_free(container);
    }
    else
    {
        ht_mutex_unlock(container->mutex);
    }
}